

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_fcmlas_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  uint uVar2;
  float32 fVar3;
  float32 fVar4;
  ulong uVar5;
  uintptr_t i;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar6 = (ulong)uVar1;
  uVar5 = (ulong)(desc >> 8 & 4);
  for (uVar7 = 0; uVar7 < uVar1 >> 2; uVar7 = uVar7 + 2) {
    fVar4 = *(float32 *)((long)vn + uVar7 * 4 + uVar5);
    uVar2 = *(uint *)((long)vm + uVar7 * 4 + (4 - uVar5));
    fVar3 = float32_muladd_arm(fVar4,*(uint *)((long)vm + uVar7 * 4 + uVar5) ^
                                     (desc >> 10 ^ desc >> 0xb) << 0x1f,
                               *(float32 *)((long)vd + uVar7 * 4),0,(float_status *)vfpst);
    *(float32 *)((long)vd + uVar7 * 4) = fVar3;
    fVar4 = float32_muladd_arm(fVar4,uVar2 ^ (desc >> 0xb) << 0x1f,
                               *(float32 *)((long)vd + uVar7 * 4 + 4),0,(float_status *)vfpst);
    *(float32 *)((long)vd + uVar7 * 4 + 4) = fVar4;
  }
  for (; uVar6 < (desc >> 2 & 0xf8) + 8; uVar6 = uVar6 + 8) {
    *(undefined8 *)((long)vd + uVar6) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_fcmlas)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float32 *d = vd;
    float32 *n = vn;
    float32 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    uint32_t neg_real = flip ^ neg_imag;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 31;
    neg_imag <<= 31;

    for (i = 0; i < opr_sz / 4; i += 2) {
        float32 e2 = n[H4(i + flip)];
        float32 e1 = m[H4(i + flip)] ^ neg_real;
        float32 e4 = e2;
        float32 e3 = m[H4(i + 1 - flip)] ^ neg_imag;

        d[H4(i)] = float32_muladd(e2, e1, d[H4(i)], 0, fpst);
        d[H4(i + 1)] = float32_muladd(e4, e3, d[H4(i + 1)], 0, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}